

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::IfnDefGuardTest_DifferentDelim_Test::
~IfnDefGuardTest_DifferentDelim_Test(IfnDefGuardTest_DifferentDelim_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IfnDefGuardTest).super_Test._vptr_Test = (_func_int **)&PTR__IfnDefGuardTest_018d0d60
  ;
  if ((this->super_IfnDefGuardTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_IfnDefGuardTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  pcVar2 = (this->super_IfnDefGuardTest).out_._M_dataplus._M_p;
  paVar1 = &(this->super_IfnDefGuardTest).out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(IfnDefGuardTest, DifferentDelim) {
  {
    io::Printer printer(output(), '\0');

    const IfdefGuardPrinter ifdef_guard(&printer, "A/B/E/alpha");

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "#ifndef A_B_E_ALPHA_\n"
            "#define A_B_E_ALPHA_\n"
            "\n"
            "\n"
            "#endif  // A_B_E_ALPHA_\n");
}